

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O2

void ggml_threadpool_free(ggml_threadpool *threadpool)

{
  int iVar1;
  uint uVar2;
  ggml_compute_state *pgVar3;
  long lVar4;
  
  if (threadpool == (ggml_threadpool *)0x0) {
    return;
  }
  iVar1 = threadpool->n_threads_max;
  pgVar3 = threadpool->workers;
  pthread_mutex_lock((pthread_mutex_t *)threadpool);
  lVar4 = 0;
  LOCK();
  threadpool->stop = true;
  UNLOCK();
  LOCK();
  threadpool->pause = false;
  UNLOCK();
  pthread_cond_broadcast((pthread_cond_t *)&threadpool->cond);
  pthread_mutex_unlock((pthread_mutex_t *)threadpool);
  do {
    pgVar3 = pgVar3 + 1;
    lVar4 = lVar4 + 1;
    if (iVar1 <= lVar4) {
      pthread_mutex_destroy((pthread_mutex_t *)threadpool);
      pthread_cond_destroy((pthread_cond_t *)&threadpool->cond);
      ggml_aligned_free(threadpool->workers,(long)iVar1 * 0x220);
      ggml_aligned_free(threadpool,0x140);
      return;
    }
    uVar2 = pthread_join(pgVar3->thrd,(void **)0x0);
  } while (uVar2 < 2);
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu.c"
             ,0xa23,"GGML_ASSERT(%s) failed","rc == GGML_EXIT_SUCCESS || rc == GGML_EXIT_ABORTED");
}

Assistant:

void ggml_threadpool_free(struct ggml_threadpool* threadpool) {
    if (!threadpool) return;

    const int n_threads = threadpool->n_threads_max;

#ifndef GGML_USE_OPENMP
    struct ggml_compute_state* workers = threadpool->workers;

    ggml_mutex_lock(&threadpool->mutex);

    threadpool->stop = true;
    threadpool->pause = false;

    ggml_cond_broadcast(&threadpool->cond);
    ggml_mutex_unlock(&threadpool->mutex);

    for (int j = 1; j < n_threads; j++) {
        int32_t rc = ggml_thread_join(workers[j].thrd, NULL);
        GGML_ASSERT(rc == GGML_EXIT_SUCCESS || rc == GGML_EXIT_ABORTED);
        UNUSED(rc);
    }

    ggml_mutex_destroy(&threadpool->mutex);
    ggml_cond_destroy(&threadpool->cond);
#endif // GGML_USE_OPENMP

    const size_t workers_size = sizeof(struct ggml_compute_state) * n_threads;
    ggml_aligned_free(threadpool->workers, workers_size);
    ggml_aligned_free(threadpool, sizeof(struct ggml_threadpool));
}